

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiverImpl.cpp
# Opt level: O1

Bool __thiscall Diligent::ArchiverImpl::AddPipelineState(ArchiverImpl *this,IPipelineState *pPSO)

{
  mutex *__mutex;
  IRenderPass *pObject;
  bool bVar1;
  ResourceType RVar2;
  int iVar3;
  undefined4 extraout_var;
  char (*in_R8) [92];
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>_>,_false,_false>,_bool>
  pVar4;
  RefCntAutoPtr<Diligent::SerializedPipelineStateImpl> pSerializedPSO;
  string msg;
  Char *Name;
  RefCntAutoPtr<Diligent::SerializedPipelineStateImpl> local_50;
  undefined1 local_48 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_38;
  Char *local_28;
  
  if (pPSO == (IPipelineState *)0x0) {
    return false;
  }
  local_50.m_pObject = (SerializedPipelineStateImpl *)0x0;
  (**(pPSO->super_IDeviceObject).super_IObject._vptr_IObject)(pPSO,IID_SerializedPipelineState);
  if (local_50.m_pObject == (SerializedPipelineStateImpl *)0x0) {
    iVar3 = (*(pPSO->super_IDeviceObject).super_IObject._vptr_IObject[4])(pPSO);
    FormatString<char[17],char_const*,char[45]>
              ((string *)local_48,(Diligent *)"Pipeline state \'",
               (char (*) [17])CONCAT44(extraout_var,iVar3),
               (char **)"\' was not created by a serialization device.",(char (*) [45])in_R8);
    DebugAssertionFailed
              ((Char *)CONCAT44(local_48._4_4_,local_48._0_4_),"AddPipelineState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/ArchiverImpl.cpp"
               ,0x144);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_48._4_4_,local_48._0_4_) != &aStack_38) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_48._4_4_,local_48._0_4_),aStack_38._M_allocated_capacity + 1
                     );
    }
  }
  else {
    local_28 = ((local_50.m_pObject)->m_Desc).super_DeviceObjectAttribs.Name;
    RVar2 = PipelineTypeToArchiveResourceType(((local_50.m_pObject)->m_Desc).PipelineType);
    __mutex = &this->m_PipelinesMtx;
    iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar3 != 0) {
      std::__throw_system_error(iVar3);
    }
    local_48._0_4_ = RVar2;
    HashMapStringKey::HashMapStringKey((HashMapStringKey *)(local_48 + 8),local_28,true);
    pVar4 = std::
            _Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>>,std::allocator<std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>>>,std::__detail::_Select1st,std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::
            _M_emplace<Diligent::DeviceObjectArchive::NamedResourceKey,Diligent::RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>&>
                      ((_Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>>,std::allocator<std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>>>,std::__detail::_Select1st,std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)&this->m_Pipelines,local_48,&local_50);
    if (((void *)local_48._8_8_ != (void *)0x0) && ((long)aStack_38._M_allocated_capacity < 0)) {
      operator_delete__((void *)local_48._8_8_);
    }
    local_48._8_8_ = (void *)0x0;
    aStack_38._M_allocated_capacity = 0;
    if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      pObject = ((local_50.m_pObject)->m_pRenderPass).m_pObject;
      if (pObject == (IRenderPass *)0x0) {
        bVar1 = true;
      }
      else {
        bVar1 = AddObjectToArchive<Diligent::SerializedRenderPassImpl,Diligent::IRenderPass>
                          (pObject,"Render pass",(INTERFACE_ID *)IID_SerializedRenderPass,
                           &this->m_RenderPassesMtx,&this->m_RenderPasses);
      }
      goto LAB_001b8944;
    }
    FormatString<char[27],char_const*,char[92]>
              ((string *)local_48,(Diligent *)"Pipeline state with name \'",(char (*) [27])&local_28
               ,(char **)
                "\' is already present in the archive. All pipelines of the same type must have unique names."
               ,in_R8);
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(2,CONCAT44(local_48._4_4_,local_48._0_4_),0,0,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_48._4_4_,local_48._0_4_) != &aStack_38) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_48._4_4_,local_48._0_4_),aStack_38._M_allocated_capacity + 1
                     );
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  bVar1 = false;
LAB_001b8944:
  RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>::Release(&local_50);
  return bVar1;
}

Assistant:

Bool ArchiverImpl::AddPipelineState(IPipelineState* pPSO)
{
    if (pPSO == nullptr)
        return false;

    RefCntAutoPtr<SerializedPipelineStateImpl> pSerializedPSO{pPSO, IID_SerializedPipelineState};
    if (!pSerializedPSO)
    {
        UNEXPECTED("Pipeline state '", pPSO->GetDesc().Name, "' was not created by a serialization device.");
        return false;
    }

    const auto& Desc = pSerializedPSO->GetDesc();
    const auto* Name = Desc.Name;
    // Mesh pipelines are serialized as graphics pipelines
    const auto ArchiveResType = PipelineTypeToArchiveResourceType(Desc.PipelineType);

    {
        std::lock_guard<std::mutex> Guard{m_PipelinesMtx};

        auto it_inserted = m_Pipelines.emplace(NamedResourceKey{ArchiveResType, Name, true}, pSerializedPSO);
        if (!it_inserted.second)
        {
            LOG_ERROR_MESSAGE("Pipeline state with name '", Name, "' is already present in the archive. All pipelines of the same type must have unique names.");
            return false;
        }
    }

    bool Res = true;
    if (auto* pRenderPass = pSerializedPSO->GetRenderPass())
    {
        if (!AddRenderPass(pRenderPass))
            Res = false;
    }

    return Res;
}